

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirENT(void)

{
  if (PseudoORG == DISP_NONE) {
    Error("ENT should be after DISP",(char *)0x0,PASS3);
  }
  else if ((PseudoORG == DISP_ACTIVE) && (Relocation::type != 0)) {
    Error("The DISP block did start outside of relocation block, can\'t end inside it",(char *)0x0,
          PASS3);
  }
  else if ((PseudoORG == DISP_INSIDE_RELOCATE) && (Relocation::type == 0)) {
    Error("The DISP block did start inside of relocation block, can\'t end outside of it",
          (char *)0x0,PASS3);
  }
  else {
    CurAddress = adrdisp;
    PseudoORG = DISP_NONE;
    dispPageNum = -1;
  }
  return;
}

Assistant:

static void dirENT() {
	if (DISP_NONE == PseudoORG) {
		Error("ENT should be after DISP");
		return;
	}
	// check if the DISP..ENT block is either fully inside relocation block, or engulfing it fully.
	if (DISP_ACTIVE == PseudoORG && Relocation::type) {
		Error("The DISP block did start outside of relocation block, can't end inside it");
		return;
	}
	if (DISP_INSIDE_RELOCATE == PseudoORG && !Relocation::type) {
		Error("The DISP block did start inside of relocation block, can't end outside of it");
		return;
	}
	CurAddress = adrdisp;
	PseudoORG = DISP_NONE;
	dispPageNum = LABEL_PAGE_UNDEFINED;
}